

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerqueue_unittest.cpp
# Opt level: O0

void cancel(TimerId timer)

{
  LogLevel LVar1;
  LogStream *this;
  self *this_00;
  SourceFile file;
  int64_t local_1040;
  Timestamp local_1038 [6];
  undefined1 local_1008 [12];
  Logger local_ff8;
  Timer *local_28;
  Timer *local_20;
  Timer *local_18;
  TimerId timer_local;
  
  local_20 = (Timer *)timer.m_sequence;
  local_28 = timer.m_timer;
  local_18 = local_28;
  timer_local.m_timer = local_20;
  sznet::net::EventLoop::cancel(g_timequeue_loop,timer);
  LVar1 = sznet::Logger::logLevel();
  if ((int)LVar1 < 3) {
    sznet::Logger::SourceFile::SourceFile<111>
              ((SourceFile *)local_1008,
               (char (*) [111])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/timer/timerqueue_unittest.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_1008._0_8_;
    file.m_size = local_1008._8_4_;
    sznet::Logger::Logger(&local_ff8,file,0x27);
    this = sznet::Logger::stream(&local_ff8);
    this_00 = sznet::LogStream::operator<<(this,"cancelled at ");
    local_1040 = (int64_t)sznet::Timestamp::now();
    sznet::Timestamp::toFormattedString_abi_cxx11_(local_1038,SUB81(&local_1040,0));
    sznet::LogStream::operator<<(this_00,(string *)local_1038);
    std::__cxx11::string::~string((string *)local_1038);
    sznet::Logger::~Logger(&local_ff8);
  }
  return;
}

Assistant:

void cancel(TimerId timer)
{
	g_timequeue_loop->cancel(timer);
	LOG_INFO << "cancelled at " << Timestamp::now().toFormattedString();
}